

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O2

string * __thiscall
PcodeGenerator::GetNextTemp_abi_cxx11_(string *__return_storage_ptr__,PcodeGenerator *this)

{
  allocator local_51;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this->m_temp_count = this->m_temp_count + 1;
  std::__cxx11::string::string((string *)&local_30,"t",&local_51);
  std::__cxx11::to_string(&local_50,this->m_temp_count);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string GetNextTemp() {
        m_temp_count++;
        string str = string("t") + std::to_string(m_temp_count);
        return str;
    }